

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  MemoryStream *pMVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  SizeType memberCount;
  
  pMVar1 = is->is_;
  if (pMVar1->src_ != pMVar1->end_) {
    pMVar1->src_ = pMVar1->src_ + 1;
  }
  bVar3 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::StartObject(handler);
  if (bVar3) {
    SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>(is)
    ;
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    pMVar1 = is->is_;
    pcVar2 = pMVar1->src_;
    if ((pcVar2 == pMVar1->end_) || (*pcVar2 != '}')) {
      memberCount = 1;
      while( true ) {
        pMVar1 = is->is_;
        pcVar2 = pMVar1->src_;
        if ((pcVar2 == pMVar1->end_) || (*pcVar2 != '\"')) {
          lVar4 = (long)pcVar2 - (long)pMVar1->begin_;
          *(undefined4 *)(this + 0x30) = 4;
          goto LAB_00105a8e;
        }
        ParseString<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler,true);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                  (is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pMVar1 = is->is_;
        pcVar2 = pMVar1->src_;
        if ((pcVar2 == pMVar1->end_) || (*pcVar2 != ':')) {
          lVar4 = (long)pcVar2 - (long)pMVar1->begin_;
          *(undefined4 *)(this + 0x30) = 5;
          goto LAB_00105a8e;
        }
        pMVar1->src_ = pcVar2 + 1;
        SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                  (is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                  (is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pMVar1 = is->is_;
        pcVar2 = pMVar1->src_;
        if (pcVar2 == pMVar1->end_) break;
        if (*pcVar2 != ',') {
          if (*pcVar2 != '}') break;
          pMVar1->src_ = pcVar2 + 1;
          goto LAB_00105a6b;
        }
        pMVar1->src_ = pcVar2 + 1;
        SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                  (is);
        memberCount = memberCount + 1;
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
      }
      lVar4 = (long)pcVar2 - (long)pMVar1->begin_;
      *(undefined4 *)(this + 0x30) = 6;
      goto LAB_00105a8e;
    }
    pMVar1->src_ = pcVar2 + 1;
    memberCount = 0;
LAB_00105a6b:
    bVar3 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::EndObject(handler,memberCount);
    if (bVar3) {
      return;
    }
  }
  lVar4 = (long)is->is_->src_ - (long)is->is_->begin_;
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_00105a8e:
  *(long *)(this + 0x38) = lVar4;
  return;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '{');
        is.Take();  // Skip '{'

        if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, '}')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType memberCount = 0;;) {
            if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

            ParseString<parseFlags>(is, handler, true);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++memberCount;

            switch (is.Peek()) {
                case ',':
                    is.Take();
                    SkipWhitespaceAndComments<parseFlags>(is);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    break;
                case '}':
                    is.Take();
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    return;
                default:
                    RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
            }

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == '}') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }